

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::AddWithCarry(BigUnsigned<4> *this,int index,uint64_t value)

{
  int *piVar1;
  int local_30 [3];
  uint32_t local_24;
  uint32_t low;
  uint32_t high;
  uint64_t value_local;
  BigUnsigned<4> *pBStack_10;
  int index_local;
  BigUnsigned<4> *this_local;
  
  if ((value != 0) && (index < 4)) {
    local_24 = (uint32_t)(value >> 0x20);
    local_30[2] = (int)value;
    this->words_[index] = local_30[2] + this->words_[index];
    _low = value;
    value_local._4_4_ = index;
    pBStack_10 = this;
    if ((this->words_[index] < (uint)local_30[2]) && (local_24 = local_24 + 1, local_24 == 0)) {
      AddWithCarry(this,index + 2,1);
    }
    else if (local_24 == 0) {
      local_30[1] = 4;
      local_30[0] = index + 1;
      piVar1 = std::max<int>(local_30,&this->size_);
      piVar1 = std::min<int>(local_30 + 1,piVar1);
      this->size_ = *piVar1;
    }
    else {
      AddWithCarry(this,index + 1,local_24);
    }
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint64_t value) {
    if (value && index < max_words) {
      uint32_t high = value >> 32;
      uint32_t low = value & 0xffffffff;
      words_[index] += low;
      if (words_[index] < low) {
        ++high;
        if (high == 0) {
          // Carry from the low word caused our high word to overflow.
          // Short circuit here to do the right thing.
          AddWithCarry(index + 2, static_cast<uint32_t>(1));
          return;
        }
      }
      if (high > 0) {
        AddWithCarry(index + 1, high);
      } else {
        // Normally 32-bit AddWithCarry() sets size_, but since we don't call
        // it when `high` is 0, do it ourselves here.
        size_ = (std::min)(max_words, (std::max)(index + 1, size_));
      }
    }
  }